

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::HostTransitionImageLayout
          (VulkanLogicalDevice *this,VkHostImageLayoutTransitionInfoEXT *TransitionInfo)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  VkResult err;
  VkHostImageLayoutTransitionInfoEXT *TransitionInfo_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._12_4_ = (*vkTransitionImageLayoutEXT)(this->m_VkDevice,1,TransitionInfo);
  if (msg.field_2._12_4_ != VK_SUCCESS) {
    Diligent::FormatString<char[34]>
              ((string *)local_40,(char (*) [34])"Failed to transition image layout");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"HostTransitionImageLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2e9);
    std::__cxx11::string::~string((string *)local_40);
  }
  return msg.field_2._12_4_;
}

Assistant:

VkResult VulkanLogicalDevice::HostTransitionImageLayout(const VkHostImageLayoutTransitionInfoEXT& TransitionInfo) const
{
#if DILIGENT_USE_VOLK
    VkResult err = vkTransitionImageLayoutEXT(m_VkDevice, 1, &TransitionInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to transition image layout");
    return err;
#else
    UNSUPPORTED("Host image layout transition is not supported when vulkan library is linked statically");
    return VK_ERROR_FEATURE_NOT_PRESENT;
#endif
}